

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SequenceFeatureType::MergeFrom
          (SequenceFeatureType *this,SequenceFeatureType *from)

{
  void *pvVar1;
  LogMessage *other;
  SizeRange *pSVar2;
  Int64FeatureType *pIVar3;
  StringFeatureType *pSVar4;
  Int64FeatureType *from_00;
  StringFeatureType *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/FeatureTypes.pb.cc"
               ,0x1044);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (SequenceFeatureType *)&_SequenceFeatureType_default_instance_) &&
     (from->sizerange_ != (SizeRange *)0x0)) {
    if (this->sizerange_ == (SizeRange *)0x0) {
      pSVar2 = (SizeRange *)operator_new(0x28);
      SizeRange::SizeRange(pSVar2);
      this->sizerange_ = pSVar2;
    }
    pSVar2 = from->sizerange_;
    if (pSVar2 == (SizeRange *)0x0) {
      pSVar2 = (SizeRange *)&_SizeRange_default_instance_;
    }
    SizeRange::MergeFrom(this->sizerange_,pSVar2);
  }
  if (from->_oneof_case_[0] == 3) {
    if (this->_oneof_case_[0] != 3) {
      clear_Type(this);
      this->_oneof_case_[0] = 3;
      pSVar4 = (StringFeatureType *)operator_new(0x18);
      StringFeatureType::StringFeatureType(pSVar4);
      (this->Type_).stringtype_ = pSVar4;
    }
    pSVar4 = (this->Type_).stringtype_;
    if (from->_oneof_case_[0] == 3) {
      from_01 = (from->Type_).stringtype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_01 = (StringFeatureType *)&_StringFeatureType_default_instance_;
    }
    StringFeatureType::MergeFrom(pSVar4,from_01);
  }
  else if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_Type(this);
      this->_oneof_case_[0] = 1;
      pIVar3 = (Int64FeatureType *)operator_new(0x18);
      Int64FeatureType::Int64FeatureType(pIVar3);
      (this->Type_).int64type_ = pIVar3;
    }
    pIVar3 = (this->Type_).int64type_;
    if (from->_oneof_case_[0] == 1) {
      from_00 = (from->Type_).int64type_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_00 = (Int64FeatureType *)&_Int64FeatureType_default_instance_;
    }
    Int64FeatureType::MergeFrom(pIVar3,from_00);
  }
  return;
}

Assistant:

void SequenceFeatureType::MergeFrom(const SequenceFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SequenceFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_sizerange()) {
    mutable_sizerange()->::CoreML::Specification::SizeRange::MergeFrom(from.sizerange());
  }
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}